

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void print_m2v(FILE *out,char *indent,m2v *M)

{
  uint uVar1;
  char *pcVar2;
  int *in_RDX;
  m2v *in_RSI;
  FILE *in_RDI;
  int c;
  int r;
  int local_20;
  int local_1c;
  
  for (local_1c = 0; local_1c < *in_RDX; local_1c = local_1c + 1) {
    pcVar2 = " ";
    if (local_1c == 0) {
      pcVar2 = "[";
    }
    fprintf(in_RDI,"%s%s",in_RSI,pcVar2);
    for (local_20 = 0; local_20 < in_RDX[1]; local_20 = local_20 + 1) {
      uVar1 = m2v_get_el(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
      fprintf(in_RDI,"%d",(ulong)uVar1);
    }
    pcVar2 = "";
    if (local_1c == *in_RDX + -1) {
      pcVar2 = " ]";
    }
    fprintf(in_RDI,"%s\n",pcVar2);
  }
  return;
}

Assistant:

UNUSED
static void print_m2v(FILE* out, const char* indent, const m2v* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		fprintf(out, "%s%s", indent, (r == 0 ? "[" : " "));
		for (int c = 0; c < M->n_col; ++c) {
			fprintf(out, "%d", (int)m2v_get_el(M, r, c));
		}
		fprintf(out, "%s\n", ((r == M->n_row - 1) ? " ]" : ""));
	}
}